

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O3

void __thiscall TimerHeap::downHeap(TimerHeap *this,size_t index)

{
  pointer psVar1;
  pointer psVar2;
  element_type *peVar3;
  element_type *peVar4;
  long lVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  pointer psVar7;
  ulong uVar8;
  Timer *__tmp;
  ulong uVar9;
  ulong uVar11;
  ulong uVar12;
  long lVar10;
  
  uVar8 = index * 2 + 1;
  psVar7 = (this->timerHeap_).
           super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar12 = (long)(this->timerHeap_).
                 super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7 >> 4;
  if (uVar8 < uVar12) {
    lVar10 = index * 2;
    do {
      uVar9 = lVar10 + 2;
      uVar11 = uVar8;
      if (uVar9 < uVar12) {
        peVar3 = psVar7[uVar9].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        peVar4 = psVar7[uVar8].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        lVar10 = (peVar4->timeout_).sec;
        lVar5 = (peVar3->timeout_).sec;
        if ((lVar5 < lVar10) ||
           ((lVar5 == lVar10 &&
            (*(long *)((long)&peVar3->timeout_ + 8) < *(long *)((long)&peVar4->timeout_ + 8))))) {
          uVar11 = uVar9;
        }
      }
      psVar1 = psVar7 + index;
      peVar3 = psVar7[index].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      psVar2 = psVar7 + uVar11;
      peVar4 = psVar7[uVar11].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar3->timeout_).sec < (peVar4->timeout_).sec) {
        return;
      }
      if (((peVar3->timeout_).sec == (peVar4->timeout_).sec) &&
         (*(long *)((long)&peVar3->timeout_ + 8) < *(long *)((long)&peVar4->timeout_ + 8))) {
        return;
      }
      (psVar1->super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar4;
      (psVar2->super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar3;
      p_Var6 = (psVar2->super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      (psVar2->super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
           (psVar1->super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      (psVar1->super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var6;
      lVar10 = uVar11 * 2;
      uVar8 = uVar11 * 2 + 1;
      psVar7 = (this->timerHeap_).
               super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar12 = (long)(this->timerHeap_).
                     super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7 >> 4;
      index = uVar11;
    } while (uVar8 < uVar12);
  }
  return;
}

Assistant:

void TimerHeap::downHeap(size_t index) {
    size_t child = index * 2 + 1;
    while (child < timerHeap_.size()) {
        if (child + 1 < timerHeap_.size() && timerHeap_[child + 1]->timeout_ < timerHeap_[child]->timeout_) 
            ++child;
        if (timerHeap_[index]->timeout_ < timerHeap_[child]->timeout_) 
            break;
        swapHeap(index, child);
        index = child;
        child = index * 2 + 1;
    }
}